

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

char * choc::text::FloatToStringBuffer<double>::writeAndGetEnd
                 (char *pos,double value,int maxDecimalPlaces)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  uint uVar9;
  uint32_t totalLength;
  long lVar10;
  char *pcVar11;
  int maxDecimalPlaces_00;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  MantissaAndExponent value_00;
  MantissaAndExponent upperBound;
  int K;
  Limits limits;
  int *in_stack_ffffffffffffffa8;
  int local_4c;
  Limits local_48;
  
  if ((long)value < 0) {
    *pos = '-';
    value = ABS(value);
    if (value == 0.0) {
      pos[1] = '0';
      pos[2] = '.';
      pos[3] = '0';
      return pos + 4;
    }
    pos = pos + 1;
  }
  else if (value == 0.0) {
    pos[0] = '0';
    pos[1] = '.';
    pos[2] = '0';
    goto LAB_001e8b56;
  }
  if (value == INFINITY) {
    ((FloatToStringBuffer<double> *)pos)->storage[0] = 'i';
    ((FloatToStringBuffer<double> *)pos)->storage[1] = 'n';
    ((FloatToStringBuffer<double> *)pos)->storage[2] = 'f';
  }
  else {
    if (value != NAN) {
      uVar9 = (uint)((ulong)value >> 0x34) & 0x7ff;
      uVar15 = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
      if (uVar9 == 0) {
        uVar15 = (ulong)value & 0xfffffffffffff;
      }
      uVar12 = 0xfffffbce;
      if (uVar9 != 0) {
        uVar12 = (ulong)(uVar9 - 0x433);
      }
      value_00._8_8_ = uVar12;
      value_00.mantissa = uVar15;
      Limits::Limits(&local_48,value_00);
      dVar8 = (double)(local_48.upper.exponent + 0x3d) * -0.30102999566398114;
      uVar9 = (int)dVar8 + (uint)((double)(int)dVar8 < dVar8) + 0x15b;
      lVar14 = (long)((int)uVar9 >> 3) * 0x10;
      local_4c = 0x154 - (uVar9 & 0xfffffff8);
      uVar12 = *(ulong *)(createPowerOf10(int,int&)::powerOf10List + lVar14 + 0x10);
      lVar1 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar12;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar15 << (~(byte)lVar1 & 0x3f);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar12;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_48.upper.mantissa;
      lVar13 = SUB168(auVar3 * auVar6,8);
      lVar10 = -(SUB168(auVar3 * auVar6,0) >> 0x3f);
      lVar1 = lVar13 + lVar10;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar12;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_48.lower.mantissa;
      upperBound._8_8_ =
           ((SUB168(auVar2 * auVar5,0) >> 0x3f) - SUB168(auVar2 * auVar5,8)) + lVar1 + -1;
      upperBound.mantissa =
           (ulong)(local_48.upper.exponent +
                   *(int *)(createPowerOf10(int,int&)::powerOf10List + lVar14 + 0x18) + 0x40);
      totalLength = generateDigits((FloatToStringBuffer<double> *)pos,(char *)(lVar13 + lVar10 + -1)
                                   ,upperBound,
                                   (~(SUB168(auVar4 * auVar7,8) -
                                     (SUB168(auVar4 * auVar7,0) >> 0x3f)) - 1U) + lVar1,
                                   (uint64_t)&local_4c,in_stack_ffffffffffffffa8);
      maxDecimalPlaces_00 = 0x144;
      if (-1 < maxDecimalPlaces) {
        maxDecimalPlaces_00 = maxDecimalPlaces;
      }
      pcVar11 = addDecimalPointAndExponent(pos,totalLength,local_4c,maxDecimalPlaces_00);
      return pcVar11;
    }
    ((FloatToStringBuffer<double> *)pos)->storage[0] = 'n';
    ((FloatToStringBuffer<double> *)pos)->storage[1] = 'a';
    ((FloatToStringBuffer<double> *)pos)->storage[2] = 'n';
  }
LAB_001e8b56:
  return ((FloatToStringBuffer<double> *)pos)->storage + 3;
}

Assistant:

static const char* writeAndGetEnd (char* pos, FloatOrDouble value, int maxDecimalPlaces)
    {
        auto floatBits = getFloatBits (value);

        if ((floatBits & signMask) == 0)
        {
            if (isZero (floatBits))  return writeZero (pos);
        }
        else
        {
            pos = write (pos, '-');

            if (isZero (floatBits))  return writeZero (pos);

            value = -value;
            floatBits &= ~signMask;
        }

        if (floatBits == nanBits)  return write (pos, 'n', 'a', 'n');
        if (floatBits == infBits)  return write (pos, 'i', 'n', 'f');

        auto v = MantissaAndExponent::create (floatBits, floatBits & significandMask);
        Limits limits (v);

        int K;
        auto powerOf10 = createPowerOf10 (limits.upper.exponent, K);
        auto w = powerOf10 * v.normalized();
        auto upperBound = powerOf10 * limits.upper;
        upperBound.mantissa--;
        auto lowerBound = powerOf10 * limits.lower;
        lowerBound.mantissa++;

        auto totalLength = generateDigits (pos, upperBound, upperBound.mantissa - w.mantissa, upperBound.mantissa - lowerBound.mantissa, K);
        return addDecimalPointAndExponent (pos, totalLength, K, maxDecimalPlaces < 0 ? defaultNumDecimalPlaces : maxDecimalPlaces);
    }